

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::identStmt(Parser *this)

{
  Type TVar1;
  Token TVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Lexer *pLVar5;
  long lVar6;
  undefined4 uVar10;
  _Alloc_hider _Var7;
  undefined4 uVar11;
  _List_node_base *p_Var8;
  Report *pRVar9;
  undefined4 uVar12;
  undefined4 uVar13;
  _Base_ptr p_Var14;
  undefined8 uVar15;
  undefined1 auVar16 [8];
  SymbolTable *pSVar17;
  bool bVar18;
  LiteralType args_1;
  Symbol *pSVar19;
  CallableSym *this_00;
  _List_node_base *p_Var20;
  _Base_ptr p_Var21;
  undefined8 *puVar22;
  Parser *in_RSI;
  SymbolTable *this_01;
  pointer __p;
  size_type __dnew;
  unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> call;
  string name;
  SourceLocation loc;
  list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> symbols;
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  SymbolTable *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f0;
  _Base_ptr p_Stack_e0;
  _Any_data local_d8;
  SymbolTable *local_c8;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  SourceLocation local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _List_node_base local_48;
  long local_38;
  
  pLVar5 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  local_a0.filename._M_dataplus._M_p = (pointer)&local_a0.filename.field_2;
  lVar6 = *(long *)&(pLVar5->location_).filename._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,lVar6,(pLVar5->location_).filename._M_string_length + lVar6);
  uVar3 = (pLVar5->location_).end.column;
  uVar10 = (pLVar5->location_).end.offset;
  local_a0.begin.line = (pLVar5->location_).begin.line;
  local_a0.begin.column = (pLVar5->location_).begin.column;
  local_a0.begin.offset = (pLVar5->location_).begin.offset;
  local_a0.end.line = (pLVar5->location_).end.line;
  pLVar5 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  local_c0._0_8_ = &local_b0;
  _Var7._M_p = (pLVar5->stringValue_)._M_dataplus._M_p;
  local_a0.end.column = uVar3;
  local_a0.end.offset = uVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,_Var7._M_p,_Var7._M_p + (pLVar5->stringValue_)._M_string_length);
  Lexer::nextToken((in_RSI->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
  local_38 = 0;
  local_48._M_next = &local_48;
  local_48._M_prev = &local_48;
  pSVar19 = SymbolTable::lookup(in_RSI->scopeStack_,(string *)local_c0,All,
                                (list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> *
                                )&local_48);
  if (pSVar19 == (Symbol *)0x0) {
    pLVar5 = (in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
    if (pLVar5->token_ == Semicolon) {
      pSVar17 = in_RSI->scopeStack_;
      if (in_RSI->scopeStack_ == (SymbolTable *)0x0) {
        this_01 = (SymbolTable *)0x0;
      }
      else {
        do {
          this_01 = pSVar17;
          pSVar17 = this_01->outerTable_;
        } while (this_01->outerTable_ != (SymbolTable *)0x0);
      }
      this_00 = (CallableSym *)operator_new(200);
      CallableSym::CallableSym(this_00,(string *)local_c0,&local_a0);
      (this_00->super_Symbol).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__HandlerSym_001afb40;
      this_00[1].super_Symbol.super_ASTNode._vptr_ASTNode = (_func_int **)0x0;
      this_00[1].super_Symbol.super_ASTNode.location_.filename._M_dataplus._M_p = (pointer)0x0;
      local_120._24_8_ = this_00;
      pSVar19 = SymbolTable::appendSymbol
                          (this_01,(unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>
                                    *)(local_120 + 0x18));
      if ((CallableSym *)local_120._24_8_ != (CallableSym *)0x0) {
        (*(((Symbol *)local_120._24_8_)->super_ASTNode)._vptr_ASTNode[1])();
      }
      local_120._24_8_ = (_Base_ptr)0x0;
      p_Var20 = (_List_node_base *)operator_new(0x18);
      p_Var20[1]._M_next = (_List_node_base *)pSVar19;
      std::__detail::_List_node_base::_M_hook(p_Var20);
      local_38 = local_38 + 1;
      goto LAB_0012fd2b;
    }
    pRVar9 = in_RSI->report_;
    local_120._0_8_ = (SymbolTable *)0x14;
    local_100 = (undefined1  [8])&aStack_f0;
    local_100 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_100,(ulong)local_120);
    aStack_f0._M_allocated_capacity = local_120._0_8_;
    *(undefined4 *)local_100 = 0x6e6b6e55;
    *(char *)((long)local_100 + 4) = 'o';
    *(char *)((long)local_100 + 5) = 'w';
    *(char *)((long)local_100 + 6) = 'n';
    *(char *)((long)local_100 + 7) = ' ';
    *(undefined4 *)((long)local_100 + 8) = 0x626d7973;
    *(char *)((long)local_100 + 0xc) = 'o';
    *(char *)((long)local_100 + 0xd) = 'l';
    *(char *)((long)local_100 + 0xe) = ' ';
    *(char *)((long)local_100 + 0xf) = '\'';
    *(undefined4 *)((long)local_100 + 0x10) = 0x2e277d7b;
    local_f8 = (SymbolTable *)local_120._0_8_;
    *(char *)((long)local_100 + local_120._0_8_) = '\0';
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_c0._0_8_,(pointer)(local_c0._8_8_ + local_c0._0_8_));
    diagnostics::Report::typeError<std::__cxx11::string>
              (pRVar9,&pLVar5->lastLocation_,(string *)local_100,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != (undefined1  [8])&aStack_f0) {
      operator_delete((void *)local_100,aStack_f0._M_allocated_capacity + 1);
    }
LAB_0012ff00:
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  }
  else {
LAB_0012fd2b:
    TVar1 = pSVar19->type_;
    if (TVar1 - BuiltinFunction < 2) {
      callStmt((Parser *)local_100,
               (list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> *)in_RSI);
      auVar16 = local_100;
      if (local_100 == (undefined1  [8])0x0) {
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
        p_Var21 = (_Base_ptr)0x0;
      }
      else {
        p_Var21 = (_Base_ptr)operator_new(0x48);
        local_100 = (undefined1  [8])0x0;
        *(undefined ***)p_Var21 = &PTR__ASTNode_001af890;
        p_Var21->_M_parent = (_Base_ptr)&p_Var21->_M_right;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&p_Var21->_M_parent,*(long *)((long)auVar16 + 8),
                   *(long *)((long)auVar16 + 0x10) + *(long *)((long)auVar16 + 8));
        p_Var21[1]._M_right = *(_Base_ptr *)((long)auVar16 + 0x38);
        uVar12 = *(undefined4 *)((long)auVar16 + 0x2c);
        lVar6 = *(long *)((long)auVar16 + 0x30);
        uVar13 = *(undefined4 *)((long)auVar16 + 0x34);
        *(int *)&p_Var21[1]._M_parent = (int)*(long *)((long)auVar16 + 0x28);
        *(undefined4 *)((long)&p_Var21[1]._M_parent + 4) = uVar12;
        *(int *)&p_Var21[1]._M_left = (int)lVar6;
        *(undefined4 *)((long)&p_Var21[1]._M_left + 4) = uVar13;
        *(undefined ***)p_Var21 = &PTR__ExprStmt_001afd90;
        *(undefined1 (*) [8])(p_Var21 + 2) = auVar16;
      }
      if (local_100 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_100 + 8))();
      }
      p_Var20 = local_48._M_next;
      if (auVar16 == (undefined1  [8])0x0) goto joined_r0x001300b5;
    }
    else if (TVar1 == Handler) {
      local_100 = (undefined1  [8])((ulong)local_100 & 0xffffffffffffff00);
      local_f8 = (SymbolTable *)0x0;
      aStack_f0._M_allocated_capacity = 0;
      aStack_f0._8_8_ = 0;
      p_Stack_e0 = (_Base_ptr)0x0;
      local_d8._M_unused._M_object = (void *)0x0;
      local_d8._8_8_ = 0;
      puVar22 = (undefined8 *)operator_new(0x80);
      *puVar22 = &PTR__ASTNode_001af890;
      puVar22[1] = puVar22 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar22 + 1),local_a0.filename._M_dataplus._M_p,
                 (long)(_func_int ***)local_a0.filename._M_string_length +
                 local_a0.filename._M_dataplus._M_p);
      puVar22[7] = CONCAT44(local_a0.end.offset,local_a0.end.column);
      puVar22[5] = CONCAT44(local_a0.begin.column,local_a0.begin.line);
      puVar22[6] = CONCAT44(local_a0.end.line,local_a0.begin.offset);
      *puVar22 = &PTR__CallExpr_001afc70;
      puVar22[8] = pSVar19;
      *(string *)(puVar22 + 9) = local_100[0];
      puVar22[10] = local_f8;
      puVar22[0xb] = aStack_f0._M_allocated_capacity;
      puVar22[0xc] = aStack_f0._8_8_;
      aStack_f0._8_8_ = 0;
      local_f8 = (SymbolTable *)0x0;
      aStack_f0._M_allocated_capacity = 0;
      puVar22[0xd] = p_Stack_e0;
      puVar22[0xe] = local_d8._M_unused._M_object;
      puVar22[0xf] = local_d8._8_8_;
      local_d8._8_8_ = 0;
      p_Stack_e0 = (_Base_ptr)0x0;
      local_d8._M_unused._M_object = (void *)0x0;
      p_Var21 = (_Base_ptr)operator_new(0x48);
      *(undefined ***)p_Var21 = &PTR__ASTNode_001af890;
      p_Var21->_M_parent = (_Base_ptr)&p_Var21->_M_right;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&p_Var21->_M_parent,puVar22[1],puVar22[2] + puVar22[1]);
      p_Var21[1]._M_right = (_Base_ptr)puVar22[7];
      p_Var14 = (_Base_ptr)puVar22[6];
      p_Var21[1]._M_parent = (_Base_ptr)puVar22[5];
      p_Var21[1]._M_left = p_Var14;
      *(undefined ***)p_Var21 = &PTR__ExprStmt_001afd90;
      *(undefined8 **)(p_Var21 + 2) = puVar22;
      ParamList::~ParamList((ParamList *)local_100);
    }
    else {
      p_Var21 = (_Base_ptr)0x0;
      if (TVar1 == Variable) {
        bVar18 = expect(in_RSI,Assign);
        if (((!bVar18) ||
            (Lexer::nextToken((in_RSI->lexer_)._M_t.
                              super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                              .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl),
            !bVar18)) ||
           (logicExpr((Parser *)local_120), uVar15 = local_120._0_8_,
           (SymbolTable *)local_120._0_8_ == (SymbolTable *)0x0)) goto LAB_0012ff00;
        local_120._12_4_ = (**(code **)(*pSVar19[1].super_ASTNode._vptr_ASTNode + 0x18))();
        args_1 = (*(code *)(((list_type *)uVar15)->
                           super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[3]._M_t.
                           super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>
                 )(uVar15);
        if (local_120._12_4_ == args_1) {
          pLVar5 = (in_RSI->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
          local_a0.end.offset = (pLVar5->lastLocation_).end.offset;
          uVar4 = (pLVar5->lastLocation_).end.line;
          uVar11 = (pLVar5->lastLocation_).end.column;
          local_a0.end.line = uVar4;
          local_a0.end.column = uVar11;
          p_Var21 = (_Base_ptr)operator_new(0x50);
          local_c8 = (SymbolTable *)local_120._0_8_;
          local_120._0_8_ = (SymbolTable *)0x0;
          *(undefined ***)p_Var21 = &PTR__ASTNode_001af890;
          p_Var21->_M_parent = (_Base_ptr)&p_Var21->_M_right;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&p_Var21->_M_parent,local_a0.filename._M_dataplus._M_p,
                     (long)(_func_int ***)local_a0.filename._M_string_length +
                     local_a0.filename._M_dataplus._M_p);
          p_Var21[1]._M_right = (_Base_ptr)CONCAT44(local_a0.end.offset,local_a0.end.column);
          *(uint *)&p_Var21[1]._M_parent = local_a0.begin.line;
          *(uint *)((long)&p_Var21[1]._M_parent + 4) = local_a0.begin.column;
          *(uint *)&p_Var21[1]._M_left = local_a0.begin.offset;
          *(uint *)((long)&p_Var21[1]._M_left + 4) = local_a0.end.line;
          *(undefined ***)p_Var21 = &PTR__AssignStmt_001afe10;
          *(Symbol **)(p_Var21 + 2) = pSVar19;
          p_Var21[2]._M_parent = (_Base_ptr)local_c8;
        }
        else {
          pLVar5 = (in_RSI->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
          pRVar9 = in_RSI->report_;
          local_100 = (undefined1  [8])&aStack_f0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_100,"Type mismatch in assignment. Expected <{}> but got <{}>.",
                     "");
          diagnostics::Report::typeError<flow::LiteralType,flow::LiteralType>
                    (pRVar9,&pLVar5->lastLocation_,(string *)local_100,local_120._12_4_,args_1);
          if (local_100 != (undefined1  [8])&aStack_f0) {
            operator_delete((void *)local_100,aStack_f0._M_allocated_capacity + 1);
          }
          *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
          p_Var21 = (_Base_ptr)0x0;
        }
        if ((SymbolTable *)local_120._0_8_ != (SymbolTable *)0x0) {
          (*(code *)(((list_type *)local_120._0_8_)->
                    super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                    super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>
          )();
        }
        p_Var20 = local_48._M_next;
        if (local_120._12_4_ != args_1) goto joined_r0x001300b5;
      }
    }
    TVar2 = ((in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_;
    if ((TVar2 == Unless) || (TVar2 == If)) {
      local_120._16_8_ = p_Var21;
      postscriptStmt(this,(unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
                          in_RSI);
      if ((_Base_ptr)local_120._16_8_ != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_120._16_8_ + 8))();
      }
      local_120._16_8_ = (_Base_ptr)0x0;
    }
    else {
      bVar18 = expect(in_RSI,Semicolon);
      if ((!bVar18) ||
         (Lexer::nextToken((in_RSI->lexer_)._M_t.
                           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                           .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl), !bVar18
         )) {
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
        p_Var20 = local_48._M_next;
        goto joined_r0x001300b5;
      }
      *(_Base_ptr *)&(this->features_)._M_t._M_impl = p_Var21;
    }
  }
  p_Var21 = (_Base_ptr)0x0;
  p_Var20 = local_48._M_next;
joined_r0x001300b5:
  while (p_Var20 != &local_48) {
    p_Var8 = (((_List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> *)
              &p_Var20->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var20,0x18);
    p_Var20 = p_Var8;
  }
  if (p_Var21 != (_Base_ptr)0x0) {
    (**(code **)(*(long *)p_Var21 + 8))(p_Var21);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._0_8_ != &local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.filename._M_dataplus._M_p != &local_a0.filename.field_2) {
    operator_delete(local_a0.filename._M_dataplus._M_p,
                    local_a0.filename.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::identStmt() {
  // identStmt  ::= callStmt | assignStmt
  // callStmt   ::= NAME ['(' paramList ')' | paramList] (';' | LF)
  // assignStmt ::= NAME '=' expr [';' | LF]
  //
  // NAME may be a builtin-function, builtin-handler, handler-name, or variable.

  SourceLocation loc(location());
  std::string name = stringValue();
  nextToken();  // IDENT

  std::unique_ptr<Stmt> stmt;
  std::list<Symbol*> symbols;
  Symbol* callee = currentScope()->lookup(name, Lookup::All, &symbols);
  if (!callee) {
    // XXX assume that given symbol is a auto forward-declared handler that's
    // being defined later in the source.
    if (token() != Token::Semicolon) {
      report_.typeError(lastLocation(), "Unknown symbol '{}'.", name);
      return nullptr;
    }

    callee = (HandlerSym*)globalScope()->appendSymbol(
        std::make_unique<HandlerSym>(name, loc));
    symbols.push_back(callee);
  }

  switch (callee->type()) {
    case Symbol::Variable: {  // var '=' expr (';' | LF)
      if (!consume(Token::Assign)) return nullptr;

      std::unique_ptr<Expr> value = expr();
      if (!value) return nullptr;

      VariableSym* var = static_cast<VariableSym*>(callee);
      LiteralType leftType = var->initializer()->getType();
      LiteralType rightType = value->getType();
      if (leftType != rightType) {
        report_.typeError(
            lastLocation(),
            "Type mismatch in assignment. Expected <{}> but got <{}>.",
            leftType, rightType);
        return nullptr;
      }

      stmt = std::make_unique<AssignStmt>(var, std::move(value),
                                          loc.update(end()));
      break;
    }
    case Symbol::BuiltinFunction:
    case Symbol::BuiltinHandler: {
      auto call = callStmt(symbols);
      if (!call) {
        return nullptr;
      }
      stmt = std::make_unique<ExprStmt>(std::move(call));
      break;
    }
    case Symbol::Handler:
      stmt = std::make_unique<ExprStmt>(
          std::make_unique<CallExpr>(loc, (CallableSym*)callee, ParamList()));
      break;
    default:
      break;
  }

  // postscript statement handling
  if (testTokens(Token::If, Token::Unless))
      return postscriptStmt(std::move(stmt));

  if (!consume(Token::Semicolon))
    return nullptr;

  return stmt;
}